

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_generators.hpp
# Opt level: O0

void __thiscall
Catch::Generators::Generators<signed_char>::
Generators<Catch::Generators::GeneratorWrapper<signed_char>,int,signed_char,signed_char,int>
          (Generators<signed_char> *this,GeneratorWrapper<signed_char> *moreGenerators,
          int *moreGenerators_1,char *moreGenerators_2,char *moreGenerators_3,int *moreGenerators_4)

{
  int *moreGenerators_local_4;
  char *moreGenerators_local_3;
  char *moreGenerators_local_2;
  int *moreGenerators_local_1;
  GeneratorWrapper<signed_char> *moreGenerators_local;
  Generators<signed_char> *this_local;
  
  IGenerator<signed_char>::IGenerator(&this->super_IGenerator<signed_char>);
  (this->super_IGenerator<signed_char>).super_GeneratorUntypedBase._vptr_GeneratorUntypedBase =
       (_func_int **)&PTR_next_007bddf8;
  std::
  vector<Catch::Generators::GeneratorWrapper<signed_char>,_std::allocator<Catch::Generators::GeneratorWrapper<signed_char>_>_>
  ::vector(&this->m_generators);
  this->m_current = 0;
  std::
  vector<Catch::Generators::GeneratorWrapper<signed_char>,_std::allocator<Catch::Generators::GeneratorWrapper<signed_char>_>_>
  ::reserve(&this->m_generators,5);
  add_generators<Catch::Generators::GeneratorWrapper<signed_char>,int,signed_char,signed_char,int>
            (this,moreGenerators,moreGenerators_1,moreGenerators_2,moreGenerators_3,moreGenerators_4
            );
  return;
}

Assistant:

Generators(Gs &&... moreGenerators) {
            m_generators.reserve(sizeof...(Gs));
            add_generators(CATCH_FORWARD(moreGenerators)...);
        }